

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_nameLength(ENCODING *enc,char *ptr)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = (int)ptr;
  lVar2 = 2;
  do {
    bVar1 = *ptr;
    lVar4 = 4;
    if (3 < bVar1 - 0xd8) {
      lVar4 = lVar2;
      if (bVar1 == 0) {
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
        if ((0x1d < bVar1) ||
           ((((0x2f400020U >> (bVar1 & 0x1f) & 1) == 0 && (lVar4 = 3, bVar1 != 6)) &&
            (lVar4 = 4, bVar1 != 7)))) {
LAB_005adc0b:
          return (int)ptr - iVar3;
        }
      }
      else if (bVar1 == 0xff) {
        if (0xfd < ((byte *)ptr)[1]) goto LAB_005adc0b;
      }
      else if (bVar1 - 0xdc < 4) goto LAB_005adc0b;
    }
    ptr = (char *)((byte *)ptr + lVar4);
  } while( true );
}

Assistant:

PREFIX(nameLength)(const ENCODING *enc, const char *ptr) {
  const char *start = ptr;
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
#  ifdef XML_NS
    case BT_COLON:
#  endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      ptr += MINBPC(enc);
      break;
    default:
      return (int)(ptr - start);
    }
  }
}